

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.cpp
# Opt level: O3

void __thiscall chrono::ChObj::ChObj(ChObj *this,ChObj *other)

{
  int iVar1;
  
  this->_vptr_ChObj = (_func_int **)&PTR__ChObj_00b03460;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  iVar1 = GetUniqueIntID();
  this->m_identifier = iVar1;
  std::__cxx11::string::_M_assign((string *)&this->m_name);
  this->ChTime = other->ChTime;
  return;
}

Assistant:

ChObj::ChObj(const ChObj& other) {
    m_identifier = GetUniqueIntID();

    m_name = other.m_name;
    ChTime = other.ChTime;
}